

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O3

bool __thiscall
JsrtDebuggerStackFrame::Evaluate
          (JsrtDebuggerStackFrame *this,ScriptContext *scriptContext,char16 *source,int sourceLength
          ,bool isLibraryCode,bool forceSetValueProp,DynamicObject **evalResult)

{
  char16 cVar1;
  ScriptEntryExitRecord *pSVar2;
  RecyclableObject *aValue;
  _func_void *p_Var3;
  JsrtDebuggerObjectsManager *debuggerObjectsManager;
  code *pcVar4;
  size_t requestedBytes;
  bool bVar5;
  int iVar6;
  charcount_t cVar7;
  BOOL BVar8;
  undefined4 extraout_var;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  undefined4 *puVar9;
  RecyclableObject *this_01;
  WeakArenaReference<Js::IDiagObjectModelDisplay> *pWVar10;
  JsrtDebuggerObjectBase *pJVar11;
  undefined4 extraout_var_00;
  DynamicObject *pDVar12;
  ulong uVar13;
  size_t __n;
  JsrtDebuggerStackFrame *pJVar14;
  ExceptionType EVar15;
  ulong uVar16;
  void *unaff_retaddr;
  undefined1 auStack_108 [8];
  ScriptEntryExitRecord __entryExitRecord;
  undefined1 local_c0 [8];
  EnterScriptObject __enterScriptObject;
  ScriptEntryExitRecord *pSStack_68;
  uint local_5c;
  AutoNestedHandledExceptionType local_3c;
  JsrtDebuggerStackFrame *pJStack_38;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  ScriptContext *scriptContext_00;
  
  *evalResult = (DynamicObject *)0x0;
  if (this->stackFrame == (DiagStackFrame *)0x0) {
    return false;
  }
  __enterScriptObject.library._0_4_ = -1;
  local_5c = local_5c & 0xffffff00;
  iVar6 = (*this->stackFrame->_vptr_DiagStackFrame[10])();
  scriptContext_00 = (ScriptContext *)CONCAT44(extraout_var,iVar6);
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (&local_3c,
             ExceptionType_JavascriptException|ExceptionType_StackOverflow|ExceptionType_OutOfMemory
            );
  __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
  __entryExitRecord.scriptContext = (ScriptContext *)0x0;
  __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
  __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
  auStack_108 = (undefined1  [8])0x0;
  __entryExitRecord._0_1_ = 0;
  __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
  __entryExitRecord._2_6_ = 0;
  __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)local_c0,scriptContext_00,(ScriptEntryExitRecord *)auStack_108,
             unaff_retaddr,&stack0x00000000,false,false,false);
  Js::ScriptContext::OnScriptStart(scriptContext_00,false,true);
  Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_c0);
  pSVar2 = scriptContext_00->threadContext->entryExitRecord;
  *(byte *)pSVar2 = *(byte *)pSVar2 | 1;
  Js::DiagStackFrame::EvaluateImmediate
            (this->stackFrame,source,sourceLength,(uint)isLibraryCode,
             (ResolvedObject *)&__enterScriptObject.library);
  Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_c0);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_3c);
  aValue = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).undefinedValue.ptr;
  if (aValue == (RecyclableObject *)0x0) {
    return false;
  }
  cVar7 = Js::JavascriptString::GetBufferLength(source);
  pJStack_38 = this;
  this_00 = &JsrtDebugManager::GetDebugObjectArena(this->debuggerObjectsManager->jsrtDebugManager)->
             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  uVar16 = (ulong)(cVar7 + 1);
  if (cVar7 + 1 == 0) {
    pSStack_68 = (ScriptEntryExitRecord *)&DAT_00000008;
LAB_003a9728:
    RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
    pJVar14 = pJStack_38;
  }
  else {
    requestedBytes = uVar16 * 2;
    p_Var3 = (this_00->super_Allocator).outOfMemoryFunc;
    (this_00->super_Allocator).outOfMemoryFunc = (_func_void *)0x0;
    pSStack_68 = (ScriptEntryExitRecord *)
                 Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 AllocInternal(this_00,requestedBytes);
    pJVar14 = pJStack_38;
    (this_00->super_Allocator).outOfMemoryFunc = p_Var3;
    if (pSStack_68 != (ScriptEntryExitRecord *)0x0) {
      if (source == (char16 *)0x0) {
        *(char16_t *)pSStack_68 = L'\0';
        if (cVar7 != 0) {
          memset(&pSStack_68->field_0x2,0xfd,requestedBytes - 2);
        }
      }
      else {
        __n = uVar16 * 2 - 2;
        uVar13 = 1;
        do {
          cVar1 = source[uVar13 - 1];
          *(char16 *)((long)pSStack_68 + uVar13 * 2 + -2) = cVar1;
          if (cVar1 == L'\0') {
            if (uVar13 < uVar16) {
              memset((char16_t *)((long)&pSStack_68->field_0x0 + uVar13 * 2),0xfd,__n);
            }
            goto LAB_003a97d8;
          }
          uVar13 = uVar13 + 1;
          __n = __n - 2;
        } while (__n != 0xfffffffffffffffe);
        *(char16_t *)pSStack_68 = L'\0';
        if (cVar7 != 0) {
          memset(&pSStack_68->field_0x2,0xfd,requestedBytes - 2);
        }
      }
      goto LAB_003a9728;
    }
    pSStack_68 = (ScriptEntryExitRecord *)0x104c546;
  }
LAB_003a97d8:
  if (aValue == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                       ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar5) goto LAB_003a9c85;
    *puVar9 = 0;
LAB_003a98cd:
    this_01 = Js::UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (this_01 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                         ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar5) goto LAB_003a9c85;
      *puVar9 = 0;
    }
    EVar15 = ((this_01->type).ptr)->typeId;
    if ((0x57 < (int)EVar15) && (BVar8 = Js::RecyclableObject::IsExternal(this_01), BVar8 == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                         ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                         "GetTypeId aValue has invalid TypeId");
      if (!bVar5) goto LAB_003a9c85;
LAB_003a999d:
      *puVar9 = 0;
    }
  }
  else {
    if (((ulong)aValue & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/TaggedInt.inl"
                         ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                         "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar5) goto LAB_003a9c85;
      EVar15 = ExceptionType_StackOverflow|ExceptionType_OutOfMemory;
      goto LAB_003a999d;
    }
    EVar15 = ExceptionType_StackOverflow|ExceptionType_OutOfMemory;
    if ((((ulong)aValue & 0xffff000000000000) != 0x1000000000000) &&
       (EVar15 = ExceptionType_JavascriptException, (ulong)aValue >> 0x32 == 0)) goto LAB_003a98cd;
  }
  debuggerObjectsManager = pJVar14->debuggerObjectsManager;
  __entryExitRecord.next = pSStack_68;
  __entryExitRecord._52_4_ = local_5c;
  auStack_108._4_4_ = __enterScriptObject.library._4_4_;
  auStack_108._0_4_ = (PropertyId)__enterScriptObject.library;
  __entryExitRecord.scriptContext = (ScriptContext *)0x0;
  __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
  __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
  __entryExitRecord._0_8_ = scriptContext_00;
  __entryExitRecord.frameIdOfScriptExitFunction = aValue;
  __entryExitRecord.handledExceptionType = EVar15;
  local_c0 = (undefined1  [8])Js::ResolvedObject::GetObjectDisplay((ResolvedObject *)auStack_108);
  pWVar10 = BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_>::operator->
                      ((BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_> *)local_c0
                      );
  bVar5 = Memory::ReferencedArenaAdapter::AddStrongReference(pWVar10->adapter);
  if (bVar5 && pWVar10->p != (IDiagObjectModelDisplay *)0x0) {
    pJVar11 = JsrtDebuggerObjectProperty::Make
                        (debuggerObjectsManager,
                         (WeakArenaReference<Js::IDiagObjectModelDisplay> *)local_c0);
    iVar6 = (*pJVar11->_vptr_JsrtDebuggerObjectBase[2])
                      (pJVar11,__entryExitRecord._0_8_,(ulong)forceSetValueProp);
    if ((Var)CONCAT44(extraout_var_00,iVar6) == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebuggerObject.h"
                         ,0x2a,"(object != nullptr)","object != nullptr");
      if (!bVar5) {
LAB_003a9c85:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar9 = 0;
    }
    pDVar12 = (DynamicObject *)
              Js::CrossSite::MarshalVar(scriptContext,(Var)CONCAT44(extraout_var_00,iVar6),false);
    *evalResult = pDVar12;
    local_c0 = (undefined1  [8])0x0;
  }
  AutoPtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>,_Memory::HeapAllocator>::~AutoPtr
            ((AutoPtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>,_Memory::HeapAllocator>
              *)local_c0);
  return false;
}

Assistant:

bool JsrtDebuggerStackFrame::Evaluate(Js::ScriptContext* scriptContext, const char16 *source, int sourceLength, bool isLibraryCode, bool forceSetValueProp, Js::DynamicObject** evalResult)
{
    *evalResult = nullptr;
    bool success = false;
    if (this->stackFrame != nullptr)
    {
        Js::ResolvedObject resolvedObject;
        HRESULT hr = S_OK;
        Js::ScriptContext* frameScriptContext = this->stackFrame->GetScriptContext();

        Js::JavascriptExceptionObject *exceptionObject = nullptr;
        {
            BEGIN_JS_RUNTIME_CALL_EX_AND_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT_NESTED(frameScriptContext, false)
            {
                ENFORCE_ENTRYEXITRECORD_HASCALLER(frameScriptContext);
                this->stackFrame->EvaluateImmediate(source, sourceLength, isLibraryCode, &resolvedObject);
            }
            END_JS_RUNTIME_CALL_AND_TRANSLATE_AND_GET_EXCEPTION_AND_ERROROBJECT_TO_HRESULT(hr, frameScriptContext, exceptionObject);
        }

        if (resolvedObject.obj == nullptr)
        {
            resolvedObject.name = _u("{exception}");
            resolvedObject.typeId = Js::TypeIds_Error;
            resolvedObject.address = nullptr;

            if (exceptionObject != nullptr)
            {
                resolvedObject.obj = exceptionObject->GetThrownObject(scriptContext);
            }
            else
            {
                resolvedObject.obj = scriptContext->GetLibrary()->GetUndefined();
            }
        }
        else
        {
          success = true;
        }

        if (resolvedObject.obj != nullptr)
        {
            resolvedObject.scriptContext = frameScriptContext;

            charcount_t len = Js::JavascriptString::GetBufferLength(source);
            resolvedObject.name = AnewNoThrowArray(this->debuggerObjectsManager->GetDebugObjectArena(), WCHAR, len + 1);

            if (resolvedObject.name != nullptr)
            {
                wcscpy_s((WCHAR*)resolvedObject.name, len + 1, source);
            }
            else
            {
                // len can be big, if we failed just have empty string
                resolvedObject.name = _u("");
            }

            resolvedObject.typeId = Js::JavascriptOperators::GetTypeId(resolvedObject.obj);
            JsrtDebuggerObjectBase::CreateDebuggerObject<JsrtDebuggerObjectProperty>(this->debuggerObjectsManager, resolvedObject, scriptContext, forceSetValueProp, [&](Js::Var marshaledObj)
            {
                *evalResult = (Js::DynamicObject*)marshaledObj;
            });
        }
    }
    return success;
}